

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

bool __thiscall libcellml::XmlNode::hasNamespaceDefinition(XmlNode *this,string *uri)

{
  char *__s;
  __type _Var1;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string href;
  xmlNs *next;
  string *uri_local;
  XmlNode *this_local;
  
  if (this->mPimpl->mXmlNodePtr->nsDef == (xmlNs *)0x0) {
LAB_003b09bf:
    this_local._7_1_ = 0;
  }
  else {
    href.field_2._8_8_ = this->mPimpl->mXmlNodePtr->nsDef;
    do {
      if (href.field_2._8_8_ == 0) goto LAB_003b09bf;
      __s = *(char **)(href.field_2._8_8_ + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,&local_49);
      std::allocator<char>::~allocator(&local_49);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,uri);
      if (_Var1) {
        this_local._7_1_ = 1;
      }
      else {
        href.field_2._8_8_ = *href.field_2._8_8_;
      }
      std::__cxx11::string::~string((string *)local_48);
    } while (!_Var1);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool XmlNode::hasNamespaceDefinition(const std::string &uri)
{
    if (mPimpl->mXmlNodePtr->nsDef != nullptr) {
        auto next = mPimpl->mXmlNodePtr->nsDef;
        while (next != nullptr) {
            // If you have a namespace, the href cannot be empty.
            std::string href = std::string(reinterpret_cast<const char *>(next->href));
            if (href == uri) {
                return true;
            }
            next = next->next;
        }
    }
    return false;
}